

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::function_types_comment_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_function *fn)

{
  bool bVar1;
  t_struct *this_00;
  members_type *this_01;
  reference pptVar2;
  string *psVar3;
  ostream *poVar4;
  t_type *ttype;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_238
  ;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_230
  ;
  string local_228;
  string local_208;
  string local_1e8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1c8
  ;
  t_field **local_1c0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1b8
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  ostringstream out;
  t_function *fn_local;
  t_st_generator *this_local;
  
  out._368_8_ = fn;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fields);
  this_00 = t_function::get_arglist((t_function *)out._368_8_);
  this_01 = t_struct::get_members(this_00);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_1b8);
  std::operator<<((ostream *)&fields,"\"");
  local_1c0 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_01);
  local_1b8._M_current = local_1c0;
  while( true ) {
    local_1c8._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_01);
    bVar1 = __gnu_cxx::operator!=(&local_1b8,&local_1c8);
    if (!bVar1) break;
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_1b8);
    psVar3 = t_field::get_name_abi_cxx11_(*pptVar2);
    std::__cxx11::string::string((string *)&local_208,(string *)psVar3);
    t_generator::camelcase(&local_1e8,(t_generator *)this,&local_208);
    poVar4 = std::operator<<((ostream *)&fields,(string *)&local_1e8);
    poVar4 = std::operator<<(poVar4,": ");
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_1b8);
    ttype = t_field::get_type(*pptVar2);
    type_name_abi_cxx11_(&local_228,this,ttype);
    std::operator<<(poVar4,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    local_230 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator+(&local_1b8,1);
    local_238._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_01);
    bVar1 = __gnu_cxx::operator!=(&local_230,&local_238);
    if (bVar1) {
      std::operator<<((ostream *)&fields,", ");
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_1b8);
  }
  std::operator<<((ostream *)&fields,"\"");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fields);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::function_types_comment(t_function* fn) {
  std::ostringstream out;
  const vector<t_field*>& fields = fn->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << "\"";

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    out << camelcase((*f_iter)->get_name()) << ": " << type_name((*f_iter)->get_type());
    if ((f_iter + 1) != fields.end()) {
      out << ", ";
    }
  }

  out << "\"";

  return out.str();
}